

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O2

bool __thiscall pbrt::MediumHandle::IsEmissive(MediumHandle *this)

{
  ulong uVar1;
  bool bVar2;
  Float FVar3;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          ).bits;
  if (2 < (ushort)(uVar1 >> 0x30)) {
    if ((uVar1 & 0xfffe000000000000) == 0x2000000000000) {
      return false;
    }
    return 0.0 < *(float *)(*(long *)(uVar1 & 0xffffffffffff) + 0x68) &&
           *(long *)(*(long *)(uVar1 & 0xffffffffffff) + 0x60) != 0;
  }
  if ((uVar1 & 0x3000000000000) == 0x2000000000000) {
    bVar2 = CuboidMedium<pbrt::UniformGridMediumProvider>::IsEmissive
                      ((CuboidMedium<pbrt::UniformGridMediumProvider> *)(uVar1 & 0xffffffffffff));
    return bVar2;
  }
  FVar3 = DenselySampledSpectrum::MaxValue
                    ((DenselySampledSpectrum *)
                     &(((CuboidMedium<pbrt::UniformGridMediumProvider> *)(uVar1 & 0xffffffffffff))->
                      sigma_s_spec).values);
  return 0.0 < FVar3;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }